

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O1

void __thiscall minihttp::HttpSocket::_ParseHeaderFields(HttpSocket *this,char *s,size_t size)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  char *__s;
  char *pcVar4;
  mapped_type *pmVar5;
  char *pcVar6;
  size_type sVar7;
  char *pcVar8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar9;
  char *pcVar10;
  char *pcVar11;
  bool bVar12;
  string key;
  string valstr;
  key_type local_80;
  long *local_60 [2];
  long local_50 [2];
  char *local_40;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *local_38;
  
  pcVar6 = s + size;
  pmVar9 = &this->_hdrs;
  do {
    pcVar11 = s;
    if (pcVar6 <= s) {
      return;
    }
    while (iVar3 = isspace((int)*s), iVar3 != 0) {
      s = s + 1;
      pcVar11 = pcVar11 + 1;
      if (pcVar6 <= s) {
        return;
      }
    }
    __s = strchr(s,0x3a);
    if (__s == (char *)0x0) {
      bVar12 = false;
    }
    else {
      pcVar4 = strchr(__s,10);
      bVar12 = pcVar4 != (char *)0x0;
      pcVar10 = pcVar4;
      if (bVar12) {
        for (; (pcVar4[-1] == '\n' ||
               (pcVar8 = __s, local_40 = pcVar6, local_38 = pmVar9, pcVar4[-1] == '\r'));
            pcVar4 = pcVar4 + -1) {
          pcVar10 = pcVar10 + -1;
        }
        do {
          pcVar8 = pcVar8 + 1;
          iVar3 = isspace((int)*pcVar8);
          if (pcVar4 <= pcVar8) break;
        } while (iVar3 != 0);
        local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_80,s,s + ((long)__s - (long)pcVar11));
        sVar2 = local_80._M_string_length;
        _Var1._M_p = local_80._M_dataplus._M_p;
        if (local_80._M_string_length != 0) {
          sVar7 = 0;
          do {
            iVar3 = tolower((int)_Var1._M_p[sVar7]);
            _Var1._M_p[sVar7] = (char)iVar3;
            sVar7 = sVar7 + 1;
          } while (sVar2 != sVar7);
        }
        local_60[0] = local_50;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_60,pcVar8,pcVar10);
        pmVar9 = local_38;
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](local_38,&local_80);
        std::__cxx11::string::_M_assign((string *)pmVar5);
        if (local_60[0] != local_50) {
          operator_delete(local_60[0],local_50[0] + 1);
        }
        pcVar6 = local_40;
        s = pcVar4;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_80._M_dataplus._M_p != &local_80.field_2) {
          operator_delete(local_80._M_dataplus._M_p,local_80.field_2._M_allocated_capacity + 1);
          pcVar6 = local_40;
        }
      }
    }
    if (!bVar12) {
      return;
    }
  } while( true );
}

Assistant:

void HttpSocket::_ParseHeaderFields(const char *s, size_t size)
{
    // Key: Value data\r\n

    const char * const maxs = s + size;
    while(s < maxs)
    {
        while(isspace(*s))
        {
            ++s;
            if(s >= maxs)
                return;
        }
        const char * const colon = strchr(s, ':');
        if(!colon)
            return;
        const char *valEnd = strchr(colon, '\n'); // last char of val data
        if(!valEnd)
            return;
        while(valEnd[-1] == '\n' || valEnd[-1] == '\r') // skip backwards if necessary
            --valEnd;
        const char *val = colon + 1; // value starts after ':' ...
        while(isspace(*val) && val < valEnd) // skip spaces after the colon
            ++val;
        std::string key(s, colon - s);
        strToLower(key);
        std::string valstr(val, valEnd - val);
        _hdrs[key] = valstr;
        traceprint("HDR: %s: %s\n", key.c_str(), valstr.c_str());
        s = valEnd;
    }
}